

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O2

bool __thiscall wallet::CWallet::IsMine(CWallet *this,CTransaction *tx)

{
  long lVar1;
  pointer pCVar2;
  pointer pCVar3;
  isminetype iVar4;
  pointer pCVar5;
  CTxOut *txout;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pCVar2 = (tx->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pCVar3 = (tx->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
           super__Vector_impl_data._M_start;
  do {
    pCVar5 = pCVar3;
    if (pCVar5 == pCVar2) break;
    iVar4 = IsMine(this,&pCVar5->scriptPubKey);
    pCVar3 = pCVar5 + 1;
  } while (iVar4 == ISMINE_NO);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return pCVar5 != pCVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool CWallet::IsMine(const CTransaction& tx) const
{
    AssertLockHeld(cs_wallet);
    for (const CTxOut& txout : tx.vout)
        if (IsMine(txout))
            return true;
    return false;
}